

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_resolv_check(connectdata *conn,Curl_dns_entry **dns)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  CURLcode CVar7;
  timediff_t tVar8;
  long lVar9;
  char *pcVar10;
  curltime cVar11;
  curltime newer;
  curltime older;
  
  if (((conn->bits).field_0x7 & 0x40) != 0) {
    CVar7 = Curl_doh_is_resolved(conn,dns);
    return CVar7;
  }
  pCVar1 = conn->data;
  pvVar2 = (conn->async).os_specific;
  *dns = (Curl_dns_entry *)0x0;
  if (pvVar2 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar2 + 0x18));
  iVar6 = *(int *)((long)pvVar2 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar2 + 0x18));
  if (iVar6 != 0) {
    pvVar2 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar2 + 0x48),*(Curl_addrinfo **)((long)pvVar2 + 0x50));
    *(undefined8 *)((long)pvVar2 + 0x50) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *dns = (conn->async).dns;
      return CURLE_OK;
    }
    uVar3 = *(ulong *)&(conn->bits).field_0x4;
    pcVar10 = "proxy";
    if ((uVar3 & 1) == 0) {
      pcVar10 = "host";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar10,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return CURLE_COULDNT_RESOLVE_HOST - ((uint)uVar3 & 1);
  }
  cVar11 = Curl_now();
  uVar4 = (pCVar1->progress).t_startsingle.tv_sec;
  uVar5 = (pCVar1->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar11._0_12_,0);
  newer.tv_usec = SUB124(cVar11._0_12_,8);
  older._12_4_ = 0;
  tVar8 = Curl_timediff(newer,older);
  lVar9 = 0;
  if (0 < tVar8) {
    lVar9 = tVar8;
  }
  if (*(int *)((long)pvVar2 + 8) == 0) {
    iVar6 = 1;
  }
  else {
    if (lVar9 < *(long *)((long)pvVar2 + 0x10)) goto LAB_0010c8db;
    iVar6 = *(int *)((long)pvVar2 + 8) * 2;
  }
  *(int *)((long)pvVar2 + 8) = iVar6;
LAB_0010c8db:
  if (0xfa < *(uint *)((long)pvVar2 + 8)) {
    *(undefined4 *)((long)pvVar2 + 8) = 0xfa;
  }
  *(ulong *)((long)pvVar2 + 0x10) = lVar9 + (ulong)*(uint *)((long)pvVar2 + 8);
  Curl_expire(conn->data,(ulong)*(uint *)((long)pvVar2 + 8),EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolv_check(struct connectdata *conn,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)dns;
#endif

  if(conn->bits.doh)
    return Curl_doh_is_resolved(conn, dns);
  return Curl_resolver_is_resolved(conn, dns);
}